

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_wallmarks::load(xr_level_wallmarks *this,xr_reader *r)

{
  uint *puVar1;
  xr_reader *r_00;
  ulong __n;
  xr_reader *s;
  read_wm_slot local_41;
  xr_reader *local_40;
  wm_slot *local_38;
  
  r_00 = xr_reader::open_chunk(r,1);
  if (r_00 == (xr_reader *)0x0) {
    local_40 = r_00;
    r_00 = xr_reader::open_chunk(r,0);
  }
  puVar1 = (r_00->field_2).m_p_u32;
  (r_00->field_2).m_p = (uint8_t *)(puVar1 + 1);
  __n = (ulong)*puVar1;
  local_40 = r_00;
  std::vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>::reserve(&this->m_slots,__n);
  if (__n != 0) {
    do {
      local_38 = (wm_slot *)0x0;
      std::vector<xray_re::wm_slot*,std::allocator<xray_re::wm_slot*>>::
      emplace_back<xray_re::wm_slot*>
                ((vector<xray_re::wm_slot*,std::allocator<xray_re::wm_slot*>> *)this,&local_38);
      read_wm_slot::operator()
                (&local_41,
                 (this->m_slots).
                 super__Vector_base<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>._M_impl
                 .super__Vector_impl_data._M_finish + -1,r_00);
      __n = __n - 1;
    } while (__n != 0);
  }
  xr_reader::close_chunk(r,&local_40);
  return;
}

Assistant:

void xr_level_wallmarks::load(xr_reader& r)
{
	xr_reader* s = r.open_chunk(1);
	
	//before 1935 chunk_id = 0
	if (s == 0)
		s = r.open_chunk(0);

	s->r_seq(s->r_u32(), m_slots, read_wm_slot());
	r.close_chunk(s);
}